

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Book.cpp
# Opt level: O2

bool jbcoin::operator==(Book *lhs,Book *rhs)

{
  bool bVar1;
  
  bVar1 = operator==(&lhs->in,&rhs->in);
  if (bVar1) {
    bVar1 = operator==(&lhs->out,&rhs->out);
    return bVar1;
  }
  return false;
}

Assistant:

bool
operator== (Book const& lhs, Book const& rhs)
{
    return (lhs.in == rhs.in) &&
           (lhs.out == rhs.out);
}